

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

void __thiscall duckdb::Serializer::WriteValue<long>(Serializer *this,vector<long,_true> *vec)

{
  pointer plVar1;
  long *item;
  pointer plVar2;
  
  (*this->_vptr_Serializer[8])
            (this,(long)(vec->super_vector<long,_std::allocator<long>_>).
                        super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(vec->super_vector<long,_std::allocator<long>_>).
                        super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3);
  plVar1 = (vec->super_vector<long,_std::allocator<long>_>).
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  for (plVar2 = (vec->super_vector<long,_std::allocator<long>_>).
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_start; plVar2 != plVar1; plVar2 = plVar2 + 1) {
    (*this->_vptr_Serializer[0x16])(this,*plVar2);
  }
  (*this->_vptr_Serializer[9])(this);
  return;
}

Assistant:

void WriteValue(const vector<T> &vec) {
		auto count = vec.size();
		OnListBegin(count);
		for (auto &item : vec) {
			WriteValue(item);
		}
		OnListEnd();
	}